

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *
anon_unknown.dwarf_19620bb::getNameLoc
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
           *__return_storage_ptr__,HierarchicalInstanceSyntax *syntax)

{
  SourceLocation SVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  Token local_30;
  
  if (syntax->decl == (InstanceNameSyntax *)0x0) {
    local_30 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
    SVar1 = slang::parsing::Token::location(&local_30);
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x88e35c) << 0x40);
  }
  else {
    bVar2 = slang::parsing::Token::valueText(&syntax->decl->name);
    SVar1 = slang::parsing::Token::location(&syntax->decl->name);
  }
  __return_storage_ptr__->first = bVar2;
  __return_storage_ptr__->second = SVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string_view, SourceLocation> getNameLoc(const HierarchicalInstanceSyntax& syntax) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.decl) {
        name = syntax.decl->name.valueText();
        loc = syntax.decl->name.location();
    }
    else {
        name = "";
        loc = syntax.getFirstToken().location();
    }
    return std::make_pair(name, loc);
}